

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtSupport(word *t,int nVars)

{
  int iVar1;
  uint uVar2;
  int iVar;
  int iVar3;
  uint uVar4;
  
  iVar = 0;
  iVar3 = 0;
  if (0 < nVars) {
    iVar3 = nVars;
  }
  uVar4 = 0;
  for (; iVar3 != iVar; iVar = iVar + 1) {
    iVar1 = Abc_TtHasVar(t,nVars,iVar);
    uVar2 = 1 << ((byte)iVar & 0x1f);
    if (iVar1 == 0) {
      uVar2 = 0;
    }
    uVar4 = uVar4 | uVar2;
  }
  return uVar4;
}

Assistant:

static inline int Abc_TtSupport( word * t, int nVars )
{
    int v, Supp = 0;
    for ( v = 0; v < nVars; v++ )
        if ( Abc_TtHasVar( t, nVars, v ) )
            Supp |= (1 << v);
    return Supp;
}